

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureFilterMinmaxTests.cpp
# Opt level: O0

void __thiscall
gl4cts::TextureFilterMinmaxUtils::Texture2DArray::Texture2DArray(Texture2DArray *this)

{
  allocator<char> local_69;
  string local_68;
  allocator<char> local_31;
  string local_30;
  Texture2DArray *local_10;
  Texture2DArray *this_local;
  
  local_10 = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"vec3",&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"sampler2DArray",&local_69)
  ;
  SupportedTextureType::SupportedTextureType
            (&this->super_SupportedTextureType,0x8c1a,&local_30,&local_68);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator(&local_31);
  (this->super_SupportedTextureType)._vptr_SupportedTextureType =
       (_func_int **)&PTR_getTextureGL_0323b2d8;
  de::details::MovePtr<glu::Texture2DArray,_de::DefaultDeleter<glu::Texture2DArray>_>::MovePtr
            (&this->m_texture);
  return;
}

Assistant:

TextureFilterMinmaxUtils::Texture2DArray::Texture2DArray()
	: SupportedTextureType(GL_TEXTURE_2D_ARRAY, "vec3", "sampler2DArray")
{
}